

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O0

void __thiscall FNodeBuilder::Clear(FNodeBuilder *this)

{
  FVertexMapSimple *this_00;
  FNodeBuilder *this_local;
  
  this->SegsStuffed = 0;
  TArray<node_t,_node_t>::Clear(&this->Nodes);
  TArray<subsector_t,_subsector_t>::Clear(&this->Subsectors);
  TArray<unsigned_int,_unsigned_int>::Clear(&this->SubsectorSets);
  TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Clear(&this->Segs);
  TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Clear(&this->Vertices);
  TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::Clear(&this->SegList);
  TArray<unsigned_char,_unsigned_char>::Clear(&this->PlaneChecked);
  TArray<FNodeBuilder::FSimpleLine,_FNodeBuilder::FSimpleLine>::Clear(&this->Planes);
  TArray<int,_int>::Clear(&this->Touched);
  TArray<int,_int>::Clear(&this->Colinear);
  TArray<FNodeBuilder::FSplitSharer,_FNodeBuilder::FSplitSharer>::Clear(&this->SplitSharers);
  if (this->VertexMap == (IVertexMap *)0x0) {
    this_00 = (FVertexMapSimple *)operator_new(0x10);
    FVertexMapSimple::FVertexMapSimple(this_00,this);
    this->VertexMap = (IVertexMap *)this_00;
  }
  return;
}

Assistant:

void FNodeBuilder::Clear()
{
	SegsStuffed = 0;
	Nodes.Clear();
	Subsectors.Clear();
	SubsectorSets.Clear();
	Segs.Clear();
	Vertices.Clear();
	SegList.Clear();
	PlaneChecked.Clear();
	Planes.Clear();
	Touched.Clear();
	Colinear.Clear();
	SplitSharers.Clear();
	if (VertexMap == NULL)
	{
		VertexMap = new FVertexMapSimple(*this);
	}
}